

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O2

EStatusCode __thiscall
JPEGImageParser::SkipTillChar
          (JPEGImageParser *this,Byte inSkipUntilValue,unsigned_long *refSkipLimit)

{
  EStatusCode EVar1;
  bool bVar2;
  
  bVar2 = true;
  EVar1 = eSuccess;
  while (((EVar1 == eSuccess && (bVar2)) && (*refSkipLimit != 0))) {
    EVar1 = ReadStreamToBuffer(this,1);
    bVar2 = true;
    if (EVar1 == eSuccess) {
      *refSkipLimit = *refSkipLimit - 1;
      bVar2 = this->mReadBuffer[0] != inSkipUntilValue;
    }
  }
  return EVar1;
}

Assistant:

EStatusCode JPEGImageParser::SkipTillChar(IOBasicTypes::Byte inSkipUntilValue,unsigned long& refSkipLimit)
{
	EStatusCode status = PDFHummus::eSuccess;
	bool charNotFound = true;
	
	while(charNotFound && (PDFHummus::eSuccess == status) && (refSkipLimit > 0))
	{
		status = ReadStreamToBuffer(1);
		if(PDFHummus::eSuccess == status)
		{
			--refSkipLimit;
			if(mReadBuffer[0] == inSkipUntilValue)
				charNotFound = false;
		}
	}
	return status;
}